

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_10::DartCodeGenerator::GenerateMakeRule
          (DartCodeGenerator *this,Parser *parser,string *path,string *filename,string *output)

{
  _Base_ptr p_Var1;
  allocator<char> local_2c9;
  string local_2c8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  included_files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string filebase;
  DartGenerator generator;
  
  StripExtension((string *)&generator,filename);
  StripPath(&filebase,(string *)&generator);
  std::__cxx11::string::~string((string *)&generator);
  dart::DartGenerator::DartGenerator(&generator,parser,path,filename);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"",&local_2c9);
  dart::DartGenerator::Filename((string *)&included_files,&generator,&local_2c8,true);
  std::operator+(&local_278,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &included_files,": ");
  std::__cxx11::string::~string((string *)&included_files);
  std::__cxx11::string::~string((string *)&local_2c8);
  Parser::GetIncludedFilesRecursive(&included_files,parser,filename);
  for (p_Var1 = included_files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &included_files._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::operator+(&local_2c8," ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                  );
    std::__cxx11::string::append((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&included_files._M_t);
  dart::DartGenerator::~DartGenerator(&generator);
  std::__cxx11::string::~string((string *)&filebase);
  std::__cxx11::string::operator=((string *)output,(string *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  return OK;
}

Assistant:

Status GenerateMakeRule(const Parser &parser, const std::string &path,
                          const std::string &filename,
                          std::string &output) override {
    output = DartMakeRule(parser, path, filename);
    return Status::OK;
  }